

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O2

long __thiscall
Bob::ObliviousTranslateSingleAddress
          (Bob *this,long addr,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm)

{
  long arg1;
  ulong uVar1;
  char *arg1_00;
  long lVar2;
  double dVar3;
  double dVar4;
  string in_stack_ffffffffffffff88;
  allocator local_31;
  
  dVar3 = 0.0;
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(Perm->
                            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(Perm->
                            super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
    arg1_00 = "==";
    std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"==",&local_31);
    arg1 = ObliviousComparison(this,in_stack_ffffffffffffff88,(long)arg1_00,addr);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    dVar4 = ObliviousMultiplication
                      (this,arg1,
                       *(long *)((long)&((Perm->
                                         super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->second + lVar2
                                ));
    dVar3 = dVar3 + dVar4;
    lVar2 = lVar2 + 0x10;
  }
  return (long)dVar3;
}

Assistant:

long Bob::ObliviousTranslateSingleAddress(long addr, std::vector<std::pair<long,long>> Perm)
{
   double result = 0;
   long beta = 0;
   for(int i=0; i < Perm.size(); i++)
   {
       beta = ObliviousComparison("==", addr, Perm[i].first);
       result += ObliviousMultiplication(beta, Perm[i].second);
   } 
   return result;
}